

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FFlagCVar::FFlagCVar(FFlagCVar *this,char *name,FIntCVar *realvar,DWORD bitval)

{
  int local_28;
  uint local_24;
  int bit;
  DWORD bitval_local;
  FIntCVar *realvar_local;
  char *name_local;
  FFlagCVar *this_local;
  
  FBaseCVar::FBaseCVar(&this->super_FBaseCVar,name,0,(_func_void_FBaseCVar_ptr *)0x0);
  (this->super_FBaseCVar)._vptr_FBaseCVar = (_func_int **)&PTR__FFlagCVar_00b690d0;
  this->ValueVar = realvar;
  this->BitVal = bitval;
  (this->super_FBaseCVar).Flags = (this->super_FBaseCVar).Flags & 0xffffff7f;
  if (bitval == 0) {
    __assert_fail("bitval != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_cvars.cpp"
                  ,0x43a,"FFlagCVar::FFlagCVar(const char *, FIntCVar &, DWORD)");
  }
  local_28 = 0;
  local_24 = bitval;
  while (local_24 = local_24 >> 1, local_24 != 0) {
    local_28 = local_28 + 1;
  }
  this->BitNum = local_28;
  if (1 << ((byte)this->BitNum & 0x1f) == this->BitVal) {
    return;
  }
  __assert_fail("(1u << BitNum) == BitVal",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_cvars.cpp"
                ,0x443,"FFlagCVar::FFlagCVar(const char *, FIntCVar &, DWORD)");
}

Assistant:

FFlagCVar::FFlagCVar (const char *name, FIntCVar &realvar, DWORD bitval)
: FBaseCVar (name, 0, NULL),
ValueVar (realvar),
BitVal (bitval)
{
	int bit;

	Flags &= ~CVAR_ISDEFAULT;

	assert (bitval != 0);

	bit = 0;
	while ((bitval >>= 1) != 0)
	{
		++bit;
	}
	BitNum = bit;

	assert ((1u << BitNum) == BitVal);
}